

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QSize>::emplace<QSize>
          (QMovableArrayOps<QSize> *this,qsizetype i,QSize *args)

{
  QSize **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  QSize QVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>))
  goto LAB_00253ec7;
  if ((this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.size == i) {
    qVar5 = QArrayDataPointer<QSize>::freeSpaceAtEnd((QArrayDataPointer<QSize> *)this);
    if (qVar5 == 0) goto LAB_00253ebe;
    (this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.ptr
    [(this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.size] = *args;
  }
  else {
LAB_00253ebe:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QSize>::freeSpaceAtBegin((QArrayDataPointer<QSize> *)this);
      if (qVar5 == 0) goto LAB_00253ec7;
      (this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.ptr[-1] = *args;
    }
    else {
LAB_00253ec7:
      QVar4 = *args;
      bVar6 = (this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.size != 0;
      QArrayDataPointer<QSize>::detachAndGrow
                ((QArrayDataPointer<QSize> *)this,(uint)(i == 0 && bVar6),1,(QSize **)0x0,
                 (QArrayDataPointer<QSize> *)0x0);
      if (i != 0 || !bVar6) {
        Inserter::Inserter(&local_58,(QArrayDataPointer<QSize> *)this,i,1);
        *local_58.displaceFrom = QVar4;
        (local_58.data)->size = (local_58.data)->size + local_58.nInserts;
        goto LAB_00253f2e;
      }
      (this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.ptr[-1] = QVar4;
    }
    ppQVar1 = &(this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
  }
  pqVar2 = &(this->super_QGenericArrayOps<QSize>).super_QArrayDataPointer<QSize>.size;
  *pqVar2 = *pqVar2 + 1;
LAB_00253f2e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }